

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O0

bool __thiscall
tinyusdz::ascii::AsciiParser::SepBy1BasicType<tinyusdz::value::point3d>
          (AsciiParser *this,char sep,char end_symbol,
          vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_> *result)

{
  bool bVar1;
  allocator local_a1;
  string local_a0;
  undefined1 local_80 [8];
  point3d value_1;
  undefined1 local_60 [5];
  char nc;
  char c;
  undefined1 local_40 [8];
  point3d value;
  vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_> *result_local;
  char end_symbol_local;
  char sep_local;
  AsciiParser *this_local;
  
  value.z = (double)result;
  ::std::vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>::clear(result);
  bVar1 = SkipWhitespaceAndNewline(this,true);
  if (bVar1) {
    bVar1 = ReadBasicType(this,(point3d *)local_40);
    if (bVar1) {
      ::std::vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>::push_back
                ((vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_> *)
                 value.z,(value_type *)local_40);
      while (bVar1 = Eof(this), ((bVar1 ^ 0xffU) & 1) != 0) {
        bVar1 = SkipCommentAndWhitespaceAndNewline(this,true);
        if (!bVar1) {
          return false;
        }
        bVar1 = Char1(this,(char *)((long)&value_1.z + 6));
        if (!bVar1) {
          return false;
        }
        if (value_1.z._6_1_ == sep) {
          bVar1 = SkipCommentAndWhitespaceAndNewline(this,true);
          if (!bVar1) {
            return false;
          }
          bVar1 = LookChar1(this,(char *)((long)&value_1.z + 5));
          if (!bVar1) {
            return false;
          }
          if (value_1.z._5_1_ == end_symbol) break;
        }
        if (value_1.z._6_1_ != sep) {
          StreamReader::seek_from_current(this->_sr,-1);
          break;
        }
        bVar1 = SkipWhitespaceAndNewline(this,true);
        if (!bVar1) {
          return false;
        }
        bVar1 = ReadBasicType(this,(point3d *)local_80);
        if (!bVar1) break;
        ::std::vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>::
        push_back((vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_> *)
                  value.z,(value_type *)local_80);
      }
      bVar1 = ::std::vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>::
              empty((vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_> *)
                    value.z);
      if (bVar1) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_a0,"Empty array.\n",&local_a1);
        PushError(this,&local_a0);
        ::std::__cxx11::string::~string((string *)&local_a0);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_a1);
        this_local._7_1_ = false;
      }
      else {
        this_local._7_1_ = true;
      }
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)local_60,"Not starting with the value of requested type.\n",
                 (allocator *)((long)&value_1.z + 7));
      PushError(this,(string *)local_60);
      ::std::__cxx11::string::~string((string *)local_60);
      ::std::allocator<char>::~allocator((allocator<char> *)((long)&value_1.z + 7));
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool AsciiParser::SepBy1BasicType(const char sep, const char end_symbol, std::vector<T> *result) {
  result->clear();

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  {
    T value;
    if (!ReadBasicType(&value)) {
      PushError("Not starting with the value of requested type.\n");
      return false;
    }

    result->push_back(value);
  }

  while (!Eof()) {
    if (!SkipCommentAndWhitespaceAndNewline()) {
      return false;
    }

    // sep
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c == sep) {
      // Look next token
      if (!SkipCommentAndWhitespaceAndNewline()) {
        return false;
      }

      char nc;
      if (!LookChar1(&nc)) {
        return false;
      }

      if (nc == end_symbol) {
        // end
        break;
      }
    }

    if (c != sep) {
      // end
      _sr->seek_from_current(-1);  // unwind single char
      break;
    }

    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    T value;
    if (!ReadBasicType(&value)) {
      break;
    }

    result->push_back(value);


  }

  if (result->empty()) {
    PushError("Empty array.\n");
    return false;
  }

  return true;
}